

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmGeneratorTarget *target,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,cmTargetExport *te,string *includesDestinationDirs)

{
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  this_00;
  bool bVar1;
  cmValue cVar2;
  cmake *cmakeInstance;
  cmLocalGenerator *pcVar3;
  string *psVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  char *__lhs;
  allocator<char> local_291;
  string prepro;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string local_260;
  string exportDirs;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_218;
  string dirs;
  cmGeneratorExpression ge;
  string local_1c8 [32];
  string includes;
  
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x189,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(const cmGeneratorTarget *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, const cmTargetExport &, std::string &)"
                 );
  }
  includesDestinationDirs->_M_string_length = 0;
  *(includesDestinationDirs->_M_dataplus)._M_p = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES",(allocator<char> *)&dirs);
  cVar2 = cmGeneratorTarget::GetProperty(target,&includes);
  std::__cxx11::string::~string((string *)&includes);
  cmakeInstance = cmMakefile::GetCMakeInstance(target->Makefile);
  local_218.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_218.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_218);
  cmGeneratorExpression::cmGeneratorExpression(&ge,cmakeInstance,(cmListFileBacktrace *)&local_218);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_218.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  exportDirs._0_16_ = cmTarget::GetInstallIncludeDirectoriesEntries_abi_cxx11_(target->Target,te);
  cmList::
  to_string<cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_0>
            (&includes,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&exportDirs);
  cmGeneratorExpression::Preprocess(&dirs,&includes,InstallInterface,true);
  std::__cxx11::string::~string((string *)&includes);
  (*this->_vptr_cmExportFileGenerator[0x14])(this,&dirs);
  std::__cxx11::string::string(local_1c8,(string *)&dirs);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
  std::__cxx11::string::~string(local_1c8);
  this_00 = cge;
  pcVar3 = cmGeneratorTarget::GetLocalGenerator(target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"",(allocator<char> *)&local_260);
  prepro._M_dataplus._M_p = (pointer)&prepro.field_2;
  prepro._M_string_length = 0;
  prepro.field_2._M_local_buf[0] = '\0';
  psVar4 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)
                      this_00._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
                      pcVar3,&includes,target,(cmGeneratorExpressionDAGChecker *)0x0,
                      (cmGeneratorTarget *)0x0,&prepro);
  std::__cxx11::string::string((string *)&exportDirs,(string *)psVar4);
  std::__cxx11::string::~string((string *)&prepro);
  std::__cxx11::string::~string((string *)&includes);
  if (*(char *)((long)cge._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl +
               0x130) == '\x01') {
    pcVar3 = cmGeneratorTarget::GetLocalGenerator(target);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includes);
    poVar5 = std::operator<<((ostream *)&includes,"Target \"");
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar5 = std::operator<<(poVar5,(string *)psVar4);
    std::operator<<(poVar5,
                    "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
                   );
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(pcVar3,FATAL_ERROR,&prepro);
    std::__cxx11::string::~string((string *)&prepro);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includes);
    goto LAB_00431121;
  }
  if (cVar2.Value == (string *)0x0) {
    if (exportDirs._M_string_length == 0) goto LAB_00431121;
LAB_00430fe0:
    prefixItems(&exportDirs);
    std::__cxx11::string::_M_assign((string *)includesDestinationDirs);
    if (cVar2.Value == (string *)0x0) {
      __lhs = "";
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&includes,"",(allocator<char> *)&prepro);
    }
    else {
      std::__cxx11::string::string((string *)&includes,(string *)cVar2.Value);
      __lhs = ";";
    }
    std::operator+(&prepro,__lhs,&exportDirs);
    std::__cxx11::string::append((string *)&includes);
    std::__cxx11::string::~string((string *)&prepro);
    cmGeneratorExpression::Preprocess(&prepro,&includes,InstallInterface,true);
    if (prepro._M_string_length != 0) {
      ResolveTargetsInGeneratorExpressions(this,&prepro,target,NoReplaceFreeTargets);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"INTERFACE_INCLUDE_DIRECTORIES",&local_291);
      bVar1 = checkInterfaceDirs(&prepro,target,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"INTERFACE_INCLUDE_DIRECTORIES",&local_291);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&local_260);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        std::__cxx11::string::~string((string *)&local_260);
      }
    }
    std::__cxx11::string::~string((string *)&prepro);
  }
  else {
    if (exportDirs._M_string_length != 0 || (cVar2.Value)->_M_string_length != 0) goto LAB_00430fe0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES",(allocator<char> *)&prepro);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&includes);
    pmVar6->_M_string_length = 0;
    *(pmVar6->_M_dataplus)._M_p = '\0';
  }
  std::__cxx11::string::~string((string *)&includes);
LAB_00431121:
  std::__cxx11::string::~string((string *)&exportDirs);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&cge);
  std::__cxx11::string::~string((string *)&dirs);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
  cmGeneratorTarget const* target,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, cmTargetExport const& te,
  std::string& includesDestinationDirs)
{
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  includesDestinationDirs.clear();

  const char* propName = "INTERFACE_INCLUDE_DIRECTORIES";
  cmValue input = target->GetProperty(propName);

  cmGeneratorExpression ge(*target->Makefile->GetCMakeInstance());

  std::string dirs = cmGeneratorExpression::Preprocess(
    cmList::to_string(target->Target->GetInstallIncludeDirectoriesEntries(te)),
    preprocessRule, true);
  this->ReplaceInstallPrefix(dirs);
  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs =
    cge->Evaluate(target->GetLocalGenerator(), "", target);

  if (cge->GetHadContextSensitiveCondition()) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" is installed with "
         "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
         "depend on the configuration, policy values or the link interface "
         "are "
         "not supported.  Consider using target_include_directories instead.";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (!input && exportDirs.empty()) {
    return;
  }
  if ((input && input->empty()) && exportDirs.empty()) {
    // Set to empty
    properties[propName].clear();
    return;
  }

  prefixItems(exportDirs);
  includesDestinationDirs = exportDirs;

  std::string includes = (input ? *input : "");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro =
    cmGeneratorExpression::Preprocess(includes, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target);

    if (!checkInterfaceDirs(prepro, target, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}